

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall
pbrt::BinaryWriter::
write<std::shared_ptr<pbrt::Camera>,std::allocator<std::shared_ptr<pbrt::Camera>>,void,void>
          (BinaryWriter *this,
          vector<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_> *t)

{
  long lVar1;
  unsigned_long uVar2;
  bool bVar3;
  __shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2> _Stack_48;
  unsigned_long local_38;
  
  uVar2 = (long)(t->
                super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(t->
                super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 4;
  local_38 = uVar2;
  write<unsigned_long>(this,&local_38);
  lVar1 = 0;
  while (bVar3 = uVar2 != 0, uVar2 = uVar2 - 1, bVar3) {
    std::__shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_48,
               (__shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((t->
                         super__Vector_base<std::shared_ptr<pbrt::Camera>,_std::allocator<std::shared_ptr<pbrt::Camera>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super___shared_ptr<pbrt::Camera,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar1)
              );
    write<pbrt::Camera>(this,(shared_ptr<pbrt::Camera> *)&_Stack_48);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_48._M_refcount);
    lVar1 = lVar1 + 0x10;
  }
  return;
}

Assistant:

void write(const std::vector<T, A> &t)
    {
      size_t size = t.size();
      write((uint64_t)size);
      for (size_t i=0;i<size;i++)
        write(t[i]);
    }